

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O2

void __thiscall Zippy::ZipArchive::Close(ZipArchive *this)

{
  if (this->m_IsOpen == true) {
    mz_zip_reader_end(&this->m_Archive);
  }
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::clear
            (&this->m_ZipEntries);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&this->m_ArchivePath,"");
  return;
}

Assistant:

void Close() {

            if (IsOpen())
                mz_zip_reader_end(&m_Archive);
            m_ZipEntries.clear();
            m_ArchivePath = "";
        }